

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

VisitReturn __thiscall QMakeEvaluator::visitProBlock(QMakeEvaluator *this,ushort *tokPtr)

{
  VisitReturn VVar1;
  ProValueMapStack *pPVar2;
  char *pcVar3;
  qsizetype qVar4;
  char16_t *in_RSI;
  QMakeEvaluator *in_RDI;
  __off64_t *in_R8;
  size_t in_R9;
  long in_FS_OFFSET;
  QStringView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  ushort *in_stack_00000008;
  ushort *oTokPtr;
  ProKey *name;
  uint exprLen_1;
  ushort *exprPtr;
  uint exprLen;
  ProKey *variable;
  VisitReturn ret;
  ushort tok;
  uint blockLen;
  bool invert;
  bool or_op;
  bool okey;
  ProFile *pro;
  uint len_9;
  uint len_4;
  uint len_10;
  uint len_8;
  uint len_7;
  uint len_6;
  uint len_5;
  uint len_3;
  uint len_2;
  uint len_1;
  uint len;
  ProValueMapStack savedValuemapStack;
  ProStringList curr;
  uint in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb8c;
  QMakeEvaluator *in_stack_fffffffffffffb90;
  QString *in_stack_fffffffffffffb98;
  QStringView *in_stack_fffffffffffffba0;
  char *pcVar8;
  char *in_stack_fffffffffffffba8;
  QMakeEvaluator *in_stack_fffffffffffffbb0;
  QMakeEvaluator *in_stack_fffffffffffffbb8;
  ProString *in_stack_fffffffffffffbc0;
  ProFile *in_stack_fffffffffffffbc8;
  QMakeEvaluator *in_stack_fffffffffffffbd0;
  char *in_stack_fffffffffffffbd8;
  undefined8 in_stack_fffffffffffffbe0;
  QMakeEvaluator *in_stack_fffffffffffffbe8;
  char *local_410;
  char *in_stack_fffffffffffffc00;
  const_reference in_stack_fffffffffffffc08;
  ProKey *in_stack_fffffffffffffc10;
  QMakeEvaluator *in_stack_fffffffffffffc18;
  QMakeEvaluator *pQVar9;
  VisitReturn local_3c0;
  VisitReturn local_3bc;
  char16_t *pcVar10;
  bool local_39a;
  bool local_392;
  uint in_stack_fffffffffffffc9c;
  ProStringList *in_stack_fffffffffffffca0;
  undefined2 in_stack_fffffffffffffcac;
  char16_t cVar11;
  uint uVar12;
  uint uVar13;
  undefined1 in_stack_fffffffffffffcb4;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  QMakeEvaluator *this_00;
  VisitReturn local_334;
  qsizetype local_308;
  storage_type_conflict *local_300;
  QString local_238 [2];
  QString local_208 [2];
  storage_type *local_1d8;
  undefined1 local_1c8 [24];
  QString local_1b0 [2];
  QString local_180 [2];
  storage_type *local_150;
  undefined1 local_140 [24];
  qsizetype local_128;
  storage_type_conflict *local_120;
  undefined1 local_100 [184];
  Data *local_48;
  ProString *local_40;
  Data *tokPtr_00;
  char16_t *local_30;
  undefined1 local_28 [40];
  
  local_28._32_8_ = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->m_debugLevel != 0) {
    traceMsgInternal(in_RDI,"entering block");
  }
  local_48 = (Data *)0xaaaaaaaaaaaaaaaa;
  local_40 = (ProString *)0xaaaaaaaaaaaaaaaa;
  tokPtr_00 = (Data *)0xaaaaaaaaaaaaaaaa;
  ProStringList::ProStringList((ProStringList *)0x2f24e4);
  this_00 = (QMakeEvaluator *)(in_RDI->m_current).pro;
  bVar16 = 1;
  bVar15 = 0;
  bVar14 = 0;
  uVar12 = 0xaaaaaaaa;
  local_30 = in_RSI;
LAB_002f251b:
  pcVar10 = local_30 + 1;
  cVar11 = *local_30;
  if (cVar11 == L'\0') {
    if (in_RDI->m_debugLevel != 0) {
      pcVar8 = "false";
      if ((bVar16 & 1) != 0) {
        pcVar8 = "true";
      }
      traceMsgInternal(in_RDI,"leaving block, okey=%s",pcVar8);
    }
    local_334 = (VisitReturn)((bVar16 & 1) != 0);
    goto LAB_002f3ddc;
  }
  local_3c0 = 0xaaaaaaaa;
  switch(cVar11) {
  case L'\x01':
    local_30 = local_30 + 2;
    (in_RDI->m_current).line = *pcVar10;
    goto LAB_002f251b;
  case L'\x02':
  case L'\x03':
  case L'\x04':
  case L'\x05':
  case L'\x06':
    VVar1 = visitProVariable(in_stack_fffffffffffffc18,
                             (ushort)((ulong)in_stack_fffffffffffffc10 >> 0x30),
                             (ProStringList *)in_stack_fffffffffffffc08,
                             (ushort **)in_stack_fffffffffffffc00);
    if (VVar1 != ReturnError) {
      QList<ProString>::clear((QList<ProString> *)in_stack_fffffffffffffb90);
      local_30 = pcVar10;
      goto LAB_002f251b;
    }
    local_3c0 = ReturnError;
    local_30 = pcVar10;
    break;
  default:
    pcVar10 = local_30;
    local_3c0 = evaluateExpression((QMakeEvaluator *)
                                   CONCAT17(bVar16,CONCAT16(bVar15,CONCAT15(bVar14,CONCAT14(
                                                  in_stack_fffffffffffffcb4,uVar12)))),
                                   (ushort **)
                                   CONCAT26(cVar11,CONCAT24(in_stack_fffffffffffffcac,0xaaaaaaaa)),
                                   in_stack_fffffffffffffca0,
                                   SUB41(in_stack_fffffffffffffc9c >> 0x18,0));
    if ((local_3c0 != ReturnError) && (local_30 == pcVar10)) goto LAB_002f251b;
    break;
  case L'\x10':
    if ((bVar16 & 1) == (bVar15 & 1)) {
      if (in_RDI->m_debugLevel != 0) {
        qVar4 = QList<ProString>::size((QList<ProString> *)&local_48);
        if (qVar4 != 1) {
          in_stack_fffffffffffffc00 = "<invalid>";
        }
        else {
          QList<ProString>::at
                    ((QList<ProString> *)in_stack_fffffffffffffb90,
                     CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
          formatValue(in_stack_fffffffffffffbc0,SUB81((ulong)in_stack_fffffffffffffbb8 >> 0x38,0));
          QtPrivate::asString(local_1b0);
          QString::toLocal8Bit((QString *)in_stack_fffffffffffffba8);
          in_stack_fffffffffffffc00 = QByteArray::constData((QByteArray *)0x2f3566);
        }
        local_392 = qVar4 == 1;
        traceMsgInternal(in_RDI,"skipped condition %s",in_stack_fffffffffffffc00);
        if (local_392) {
          QByteArray::~QByteArray((QByteArray *)0x2f35af);
          QString::~QString((QString *)0x2f35c8);
        }
      }
    }
    else {
      qVar4 = QList<ProString>::size((QList<ProString> *)&local_48);
      if (qVar4 == 1) {
        in_stack_fffffffffffffc08 =
             QList<ProString>::at
                       ((QList<ProString> *)in_stack_fffffffffffffb90,
                        CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        in_stack_fffffffffffffc10 = (ProKey *)local_28;
        QStringView::QStringView<QString,_true>(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98)
        ;
        QVar5 = QStringView::mid((QStringView *)in_stack_fffffffffffffba8,
                                 (qsizetype)in_stack_fffffffffffffbb8,
                                 (qsizetype)in_stack_fffffffffffffbb0);
        bVar15 = isActiveConfig(in_stack_fffffffffffffbd0,QVar5,
                                SUB81((ulong)in_stack_fffffffffffffbc8 >> 0x38,0));
        if (in_RDI->m_debugLevel != 0) {
          QList<ProString>::at
                    ((QList<ProString> *)in_stack_fffffffffffffb90,
                     CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
          formatValue(in_stack_fffffffffffffbc0,SUB81((ulong)in_stack_fffffffffffffbb8 >> 0x38,0));
          QtPrivate::asString(local_180);
          QString::toLocal8Bit((QString *)in_stack_fffffffffffffba8);
          pcVar8 = QByteArray::constData((QByteArray *)0x2f3451);
          pcVar3 = "false";
          if ((bVar15 & 1) != 0) {
            pcVar3 = "true";
          }
          traceMsgInternal(in_RDI,"condition %s is %s",pcVar8,pcVar3);
          QByteArray::~QByteArray((QByteArray *)0x2f3495);
          QString::~QString((QString *)0x2f34a2);
        }
        bVar16 = (bVar15 & 1) != (bVar14 & 1);
      }
      else {
        QByteArrayView::QByteArrayView<45ul>
                  ((QByteArrayView *)in_stack_fffffffffffffba0,
                   (char (*) [45])in_stack_fffffffffffffb98);
        QVar6.m_data = local_150;
        QVar6.m_size = (qsizetype)local_140;
        QString::fromLatin1(QVar6);
        evalError(in_stack_fffffffffffffb90,
                  (QString *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        QString::~QString((QString *)0x2f3328);
        bVar16 = 0;
      }
    }
    bVar15 = (bVar16 ^ 0xff) & 1;
    bVar14 = 0;
    QList<ProString>::clear((QList<ProString> *)in_stack_fffffffffffffb90);
    local_30 = pcVar10;
    goto LAB_002f251b;
  case L'\x11':
    if ((bVar16 & 1) == (bVar15 & 1)) {
      skipExpression(in_stack_fffffffffffffbb0,(ushort **)in_stack_fffffffffffffba8);
      if (in_RDI->m_debugLevel != 0) {
        qVar4 = QList<ProString>::size((QList<ProString> *)&local_48);
        if (qVar4 != 1) {
          in_stack_fffffffffffffbd8 = "<invalid>";
        }
        else {
          QList<ProString>::at
                    ((QList<ProString> *)in_stack_fffffffffffffb90,
                     CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
          formatValue(in_stack_fffffffffffffbc0,SUB81((ulong)in_stack_fffffffffffffbb8 >> 0x38,0));
          QtPrivate::asString(local_238);
          QString::toLocal8Bit((QString *)in_stack_fffffffffffffba8);
          in_stack_fffffffffffffbd8 = QByteArray::constData((QByteArray *)0x2f398e);
        }
        local_39a = qVar4 == 1;
        traceMsgInternal(in_RDI,"skipped test function %s",in_stack_fffffffffffffbd8);
        if (local_39a) {
          QByteArray::~QByteArray((QByteArray *)0x2f39d7);
          QString::~QString((QString *)0x2f39f0);
        }
      }
    }
    else {
      qVar4 = QList<ProString>::size((QList<ProString> *)&local_48);
      if (qVar4 == 1) {
        if (in_RDI->m_debugLevel != 0) {
          QList<ProString>::at
                    ((QList<ProString> *)in_stack_fffffffffffffb90,
                     CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
          formatValue(in_stack_fffffffffffffbc0,SUB81((ulong)in_stack_fffffffffffffbb8 >> 0x38,0));
          QtPrivate::asString(local_208);
          QString::toLocal8Bit((QString *)in_stack_fffffffffffffba8);
          pcVar8 = QByteArray::constData((QByteArray *)0x2f3704);
          traceMsgInternal(in_RDI,"evaluating test function %s",pcVar8);
          QByteArray::~QByteArray((QByteArray *)0x2f372a);
          QString::~QString((QString *)0x2f3737);
        }
        QList<ProString>::at
                  ((QList<ProString> *)in_stack_fffffffffffffb90,
                   CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        local_334 = evaluateConditionalFunction
                              ((QMakeEvaluator *)in_stack_fffffffffffffbd8,
                               (ProKey *)in_stack_fffffffffffffbd0,
                               (ushort **)in_stack_fffffffffffffbc8);
        if (local_334 == ReturnFalse) {
          bVar15 = 0;
        }
        else {
          if (local_334 != ReturnTrue) {
            if (in_RDI->m_debugLevel != 0) {
              if (local_334 == ReturnError) {
                local_410 = "error";
              }
              else if (local_334 == ReturnBreak) {
                local_410 = "break";
              }
              else if (local_334 == ReturnNext) {
                local_410 = "next";
              }
              else {
                local_410 = "<invalid>";
                if (local_334 == ReturnReturn) {
                  local_410 = "return";
                }
              }
              traceMsgInternal(in_RDI,"aborting block, function status: %s",local_410);
            }
            goto LAB_002f3ddc;
          }
          bVar15 = 1;
        }
        if (in_RDI->m_debugLevel != 0) {
          pcVar8 = "false";
          if (bVar15 != 0) {
            pcVar8 = "true";
          }
          traceMsgInternal(in_RDI,"test function returned %s",pcVar8);
        }
        bVar16 = (bVar15 & 1) != (bVar14 & 1);
      }
      else {
        QByteArrayView::QByteArrayView<43ul>
                  ((QByteArrayView *)in_stack_fffffffffffffba0,
                   (char (*) [43])in_stack_fffffffffffffb98);
        QVar7.m_data = local_1d8;
        QVar7.m_size = (qsizetype)local_1c8;
        QString::fromLatin1(QVar7);
        evalError(in_stack_fffffffffffffb90,
                  (QString *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        QString::~QString((QString *)0x2f367f);
        skipExpression(in_stack_fffffffffffffbb0,(ushort **)in_stack_fffffffffffffba8);
        bVar16 = 0;
      }
    }
    bVar15 = (bVar16 ^ 0xff) & 1;
    bVar14 = 0;
    QList<ProString>::clear((QList<ProString> *)in_stack_fffffffffffffb90);
    local_30 = pcVar10;
    goto LAB_002f251b;
  case L'\x12':
    ProStringList::operator=
              ((ProStringList *)in_stack_fffffffffffffb90,
               (ProStringList *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    QList<ProString>::clear((QList<ProString> *)in_stack_fffffffffffffb90);
    local_334 = ReturnReturn;
    goto LAB_002f3a6e;
  case L'\x13':
    local_334 = ReturnBreak;
    goto LAB_002f3a6e;
  case L'\x14':
    local_334 = ReturnNext;
LAB_002f3a6e:
    if ((bVar16 & 1) != (bVar15 & 1)) {
      if (in_RDI->m_debugLevel != 0) {
        if (local_334 == ReturnError) {
          pcVar8 = "error";
        }
        else if (local_334 == ReturnBreak) {
          pcVar8 = "break";
        }
        else if (local_334 == ReturnNext) {
          pcVar8 = "next";
        }
        else {
          pcVar8 = "<invalid>";
          if (local_334 == ReturnReturn) {
            pcVar8 = "return";
          }
        }
        traceMsgInternal(in_RDI,"flow control statement \'%s\', aborting block",pcVar8);
      }
      goto LAB_002f3ddc;
    }
    if (in_RDI->m_debugLevel != 0) {
      if (local_334 == ReturnError) {
        in_stack_fffffffffffffbb8 = (QMakeEvaluator *)"error";
      }
      else if (local_334 == ReturnBreak) {
        in_stack_fffffffffffffbb0 = (QMakeEvaluator *)"break";
        in_stack_fffffffffffffbb8 = (QMakeEvaluator *)"break";
      }
      else if (local_334 == ReturnNext) {
        in_stack_fffffffffffffba8 = "next";
        in_stack_fffffffffffffbb0 = (QMakeEvaluator *)in_stack_fffffffffffffba8;
        in_stack_fffffffffffffbb8 = (QMakeEvaluator *)in_stack_fffffffffffffba8;
      }
      else {
        in_stack_fffffffffffffba8 = "<invalid>";
        in_stack_fffffffffffffbb0 = (QMakeEvaluator *)in_stack_fffffffffffffba8;
        in_stack_fffffffffffffbb8 = (QMakeEvaluator *)in_stack_fffffffffffffba8;
        if (local_334 == ReturnReturn) {
          in_stack_fffffffffffffba8 = "return";
          in_stack_fffffffffffffbb0 = (QMakeEvaluator *)in_stack_fffffffffffffba8;
          in_stack_fffffffffffffbb8 = (QMakeEvaluator *)in_stack_fffffffffffffba8;
        }
      }
      traceMsgInternal(in_RDI,"skipped flow control statement \'%s\'",in_stack_fffffffffffffbb8);
    }
    bVar16 = 0;
    bVar15 = 1;
    local_30 = pcVar10;
    goto LAB_002f251b;
  case L'\x15':
    if (in_RDI->m_debugLevel != 0) {
      traceMsgInternal(in_RDI,"NOT");
    }
    bVar14 = (bVar14 & 1) != 1;
    local_30 = pcVar10;
    goto LAB_002f251b;
  case L'\x16':
    if (in_RDI->m_debugLevel != 0) {
      traceMsgInternal(in_RDI,"AND");
    }
    bVar15 = 0;
    local_30 = pcVar10;
    goto LAB_002f251b;
  case L'\x17':
    if (in_RDI->m_debugLevel != 0) {
      traceMsgInternal(in_RDI,"OR");
    }
    bVar15 = 1;
    local_30 = pcVar10;
    goto LAB_002f251b;
  case L'\x18':
    uVar13 = *(uint *)pcVar10;
    if ((bVar16 & 1) != 0) {
      if (in_RDI->m_debugLevel != 0) {
        traceMsgInternal(in_RDI,"taking \'then\' branch");
      }
      if (uVar13 == 0) {
        local_3bc = ReturnTrue;
      }
      else {
        local_3bc = visitProBlock(this_00,(ushort *)tokPtr_00);
      }
      local_3c0 = local_3bc;
      if (in_RDI->m_debugLevel != 0) {
        traceMsgInternal(in_RDI,"finished \'then\' branch");
        local_3c0 = local_3bc;
      }
    }
    uVar12 = *(uint *)(local_30 + (ulong)uVar13 + 3);
    if ((bVar16 & 1) == 0) {
      if (in_RDI->m_debugLevel != 0) {
        traceMsgInternal(in_RDI,"taking \'else\' branch");
      }
      if (uVar12 == 0) {
        local_3c0 = ReturnTrue;
      }
      else {
        local_3c0 = visitProBlock(this_00,(ushort *)tokPtr_00);
      }
      if (in_RDI->m_debugLevel != 0) {
        traceMsgInternal(in_RDI,"finished \'else\' branch");
      }
    }
    bVar16 = 1;
    bVar15 = 0;
    local_30 = local_30 + (ulong)uVar13 + 3 + (ulong)uVar12 + 2;
    break;
  case L'\x19':
    if ((bVar16 & 1) == (bVar15 & 1)) {
      local_30 = local_30 + (ulong)(ushort)local_30[3] + 4 +
                 (ulong)*(uint *)(local_30 + (ulong)(ushort)local_30[3] + 4) + 2;
      uVar12 = *(uint *)local_30;
      if (in_RDI->m_debugLevel != 0) {
        traceMsgInternal(in_RDI,"skipped loop");
      }
      local_3c0 = ReturnTrue;
    }
    else {
      ProFile::getHashStr(in_stack_fffffffffffffbc8,(ushort **)in_stack_fffffffffffffbc0);
      in_stack_fffffffffffffca0 = (ProStringList *)(local_100 + 0x88);
      in_stack_fffffffffffffc9c = *(uint *)pcVar10;
      local_30 = local_30 + (ulong)in_stack_fffffffffffffc9c + 3;
      uVar12 = *(uint *)local_30;
      local_3c0 = visitProLoop(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_00000008
                               ,(ushort *)in_stack_fffffffffffffc08);
      ProKey::~ProKey((ProKey *)0x2f29f8);
    }
    bVar16 = 1;
    bVar15 = 0;
    local_30 = local_30 + (ulong)uVar12 + 2;
    break;
  case L'\x1a':
  case L'\x1b':
    if ((bVar16 & 1) == (bVar15 & 1)) {
      if (in_RDI->m_debugLevel != 0) {
        traceMsgInternal(in_RDI,"skipped function definition");
      }
      pcVar10 = local_30 + (ulong)(ushort)local_30[3] + 4;
      local_30 = pcVar10 + 2;
      uVar12 = *(uint *)pcVar10;
    }
    else {
      ProFile::getHashStr(in_stack_fffffffffffffbc8,(ushort **)in_stack_fffffffffffffbc0);
      pQVar9 = (QMakeEvaluator *)local_100;
      local_30 = local_30 + 3;
      uVar12 = *(uint *)pcVar10;
      visitProFunctionDef(in_stack_fffffffffffffbe8,
                          (ushort)((ulong)in_stack_fffffffffffffbe0 >> 0x30),
                          (ProKey *)in_stack_fffffffffffffbd8,(ushort *)in_stack_fffffffffffffbd0);
      if (in_RDI->m_debugLevel != 0) {
        pcVar8 = "replace";
        if (cVar11 == L'\x1a') {
          pcVar8 = "test";
        }
        QStringView::QStringView<QString,_true>(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98)
        ;
        QVar5 = QStringView::mid((QStringView *)in_stack_fffffffffffffba8,
                                 (qsizetype)in_stack_fffffffffffffbb8,
                                 (qsizetype)in_stack_fffffffffffffbb0);
        local_308 = QVar5.m_size;
        local_300 = QVar5.m_data;
        local_128 = local_308;
        local_120 = local_300;
        QStringView::toLocal8Bit((QStringView *)in_stack_fffffffffffffb90);
        pcVar3 = QByteArray::constData((QByteArray *)0x2f3094);
        traceMsgInternal(in_RDI,"defined %s function %s",pcVar8,pcVar3);
        QByteArray::~QByteArray((QByteArray *)0x2f30c2);
        in_stack_fffffffffffffc18 = pQVar9;
      }
      ProKey::~ProKey((ProKey *)0x2f30cf);
    }
    bVar16 = 1;
    bVar15 = 0;
    local_30 = local_30 + uVar12;
    goto LAB_002f251b;
  case L'\x1c':
    uVar12 = *(uint *)pcVar10;
    if (((bVar16 & 1) == (bVar15 & 1)) || (uVar12 == 0)) {
      if (in_RDI->m_debugLevel != 0) {
        traceMsgInternal(in_RDI,"skipped nesting-bypassing block");
      }
      local_3c0 = ReturnTrue;
    }
    else {
      local_100._112_8_ = (Data *)0xaaaaaaaaaaaaaaaa;
      local_100._120_8_ = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_100._128_8_ = -0x5555555555555556;
      ProValueMapStack::ProValueMapStack
                ((ProValueMapStack *)in_stack_fffffffffffffb90,
                 (ProValueMapStack *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      std::__cxx11::list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
      ::clear((list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_> *)
              in_stack_fffffffffffffb90);
      pPVar2 = &in_RDI->m_valuemapStack;
      local_100._96_8_ =
           std::__cxx11::
           list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::end
                     ((list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                       *)in_stack_fffffffffffffb90);
      std::_List_const_iterator<QMap<ProKey,_ProStringList>_>::_List_const_iterator
                ((_List_const_iterator<QMap<ProKey,_ProStringList>_> *)(local_100 + 0x68),
                 (iterator *)(local_100 + 0x60));
      local_100._80_8_ =
           std::__cxx11::
           list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::begin
                     ((list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                       *)in_stack_fffffffffffffb90);
      std::_List_const_iterator<QMap<ProKey,_ProStringList>_>::_List_const_iterator
                ((_List_const_iterator<QMap<ProKey,_ProStringList>_> *)(local_100 + 0x58),
                 (iterator *)(local_100 + 0x50));
      std::__cxx11::list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
      ::splice(&pPVar2->
                super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
               ,(int)local_100._104_8_,(__off64_t *)(local_100 + 0x70),(int)local_100._88_8_,in_R8,
               in_R9,in_stack_fffffffffffffb88);
      if (in_RDI->m_debugLevel != 0) {
        traceMsgInternal(in_RDI,"visiting nesting-bypassing block");
      }
      local_3c0 = visitProBlock(this_00,(ushort *)tokPtr_00);
      if (in_RDI->m_debugLevel != 0) {
        traceMsgInternal(in_RDI,"visited nesting-bypassing block");
      }
      local_100._64_8_ =
           std::__cxx11::
           list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::begin
                     ((list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                       *)in_stack_fffffffffffffb90);
      std::_List_const_iterator<QMap<ProKey,_ProStringList>_>::_List_const_iterator
                ((_List_const_iterator<QMap<ProKey,_ProStringList>_> *)(local_100 + 0x48),
                 (iterator *)(local_100 + 0x40));
      pPVar2 = &in_RDI->m_valuemapStack;
      local_100._48_8_ =
           std::__cxx11::
           list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::begin
                     ((list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                       *)in_stack_fffffffffffffb90);
      std::_List_const_iterator<QMap<ProKey,_ProStringList>_>::_List_const_iterator
                ((_List_const_iterator<QMap<ProKey,_ProStringList>_> *)(local_100 + 0x38),
                 (iterator *)(local_100 + 0x30));
      std::__cxx11::list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
      ::splice((list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_> *)
               (local_100 + 0x70),(int)local_100._72_8_,(__off64_t *)pPVar2,(int)local_100._56_8_,
               in_R8,in_R9,in_stack_fffffffffffffb88);
      ProValueMapStack::operator=
                ((ProValueMapStack *)in_stack_fffffffffffffb90,
                 (ProValueMapStack *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      ProValueMapStack::~ProValueMapStack((ProValueMapStack *)0x2f2e52);
    }
    bVar16 = 1;
    bVar15 = 0;
    local_30 = local_30 + (ulong)uVar12 + 3;
  }
  if ((local_3c0 != ReturnTrue) && (local_3c0 != ReturnFalse)) {
    local_334 = local_3c0;
    if (in_RDI->m_debugLevel != 0) {
      if (local_3c0 == ReturnError) {
        pcVar8 = "error";
      }
      else if (local_3c0 == ReturnBreak) {
        pcVar8 = "break";
      }
      else if (local_3c0 == ReturnNext) {
        pcVar8 = "next";
      }
      else {
        pcVar8 = "<invalid>";
        if (local_3c0 == ReturnReturn) {
          pcVar8 = "return";
        }
      }
      traceMsgInternal(in_RDI,"aborting block, status: %s",pcVar8);
      local_334 = local_3c0;
    }
LAB_002f3ddc:
    ProStringList::~ProStringList((ProStringList *)0x2f3de9);
    if (*(Data **)(in_FS_OFFSET + 0x28) != (Data *)local_28._32_8_) {
      __stack_chk_fail();
    }
    return local_334;
  }
  goto LAB_002f251b;
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::visitProBlock(
        const ushort *tokPtr)
{
    traceMsg("entering block");
    ProStringList curr;
    ProFile *pro = m_current.pro;
    bool okey = true, or_op = false, invert = false;
    uint blockLen;
    while (ushort tok = *tokPtr++) {
        VisitReturn ret;
        switch (tok) {
        case TokLine:
            m_current.line = *tokPtr++;
            continue;
        case TokAssign:
        case TokAppend:
        case TokAppendUnique:
        case TokRemove:
        case TokReplace:
            ret = visitProVariable(tok, curr, tokPtr);
            if (ret == ReturnError)
                break;
            curr.clear();
            continue;
        case TokBranch:
            blockLen = getBlockLen(tokPtr);
            if (m_cumulative) {
#ifdef PROEVALUATOR_CUMULATIVE
                if (!okey)
                    m_skipLevel++;
                ret = blockLen ? visitProBlock(tokPtr) : ReturnTrue;
                tokPtr += blockLen;
                blockLen = getBlockLen(tokPtr);
                if (!okey)
                    m_skipLevel--;
                else
                    m_skipLevel++;
                if ((ret == ReturnTrue || ret == ReturnFalse) && blockLen)
                    ret = visitProBlock(tokPtr);
                if (okey)
                    m_skipLevel--;
#endif
            } else {
                if (okey) {
                    traceMsg("taking 'then' branch");
                    ret = blockLen ? visitProBlock(tokPtr) : ReturnTrue;
                    traceMsg("finished 'then' branch");
                }
                tokPtr += blockLen;
                blockLen = getBlockLen(tokPtr);
                if (!okey) {
                    traceMsg("taking 'else' branch");
                    ret = blockLen ? visitProBlock(tokPtr) : ReturnTrue;
                    traceMsg("finished 'else' branch");
                }
            }
            tokPtr += blockLen;
            okey = true, or_op = false; // force next evaluation
            break;
        case TokForLoop:
            if (m_cumulative || okey != or_op) {
                const ProKey &variable = pro->getHashStr(tokPtr);
                uint exprLen = getBlockLen(tokPtr);
                const ushort *exprPtr = tokPtr;
                tokPtr += exprLen;
                blockLen = getBlockLen(tokPtr);
                ret = visitProLoop(variable, exprPtr, tokPtr);
            } else {
                skipHashStr(tokPtr);
                uint exprLen = getBlockLen(tokPtr);
                tokPtr += exprLen;
                blockLen = getBlockLen(tokPtr);
                traceMsg("skipped loop");
                ret = ReturnTrue;
            }
            tokPtr += blockLen;
            okey = true, or_op = false; // force next evaluation
            break;
        case TokBypassNesting:
            blockLen = getBlockLen(tokPtr);
            if ((m_cumulative || okey != or_op) && blockLen) {
                ProValueMapStack savedValuemapStack = std::move(m_valuemapStack);
                m_valuemapStack.clear();
                m_valuemapStack.splice(m_valuemapStack.end(),
                                       savedValuemapStack, savedValuemapStack.begin());
                traceMsg("visiting nesting-bypassing block");
                ret = visitProBlock(tokPtr);
                traceMsg("visited nesting-bypassing block");
                savedValuemapStack.splice(savedValuemapStack.begin(),
                                          m_valuemapStack, m_valuemapStack.begin());
                m_valuemapStack = std::move(savedValuemapStack);
            } else {
                traceMsg("skipped nesting-bypassing block");
                ret = ReturnTrue;
            }
            tokPtr += blockLen;
            okey = true, or_op = false; // force next evaluation
            break;
        case TokTestDef:
        case TokReplaceDef:
            if (m_cumulative || okey != or_op) {
                const ProKey &name = pro->getHashStr(tokPtr);
                blockLen = getBlockLen(tokPtr);
                visitProFunctionDef(tok, name, tokPtr);
                traceMsg("defined %s function %s",
                      tok == TokTestDef ? "test" : "replace", dbgKey(name));
            } else {
                traceMsg("skipped function definition");
                skipHashStr(tokPtr);
                blockLen = getBlockLen(tokPtr);
            }
            tokPtr += blockLen;
            okey = true, or_op = false; // force next evaluation
            continue;
        case TokNot:
            traceMsg("NOT");
            invert ^= true;
            continue;
        case TokAnd:
            traceMsg("AND");
            or_op = false;
            continue;
        case TokOr:
            traceMsg("OR");
            or_op = true;
            continue;
        case TokCondition:
            if (!m_skipLevel && okey != or_op) {
                if (curr.size() != 1) {
                    if (!m_cumulative || !curr.isEmpty())
                        evalError(fL1S("Conditional must expand to exactly one word."));
                    okey = false;
                } else {
                    okey = isActiveConfig(curr.at(0).toQStringView(), true);
                    traceMsg("condition %s is %s", dbgStr(curr.at(0)), dbgBool(okey));
                    okey ^= invert;
                }
            } else {
                traceMsg("skipped condition %s", curr.size() == 1 ? dbgStr(curr.at(0)) : "<invalid>");
            }
            or_op = !okey; // tentatively force next evaluation
            invert = false;
            curr.clear();
            continue;
        case TokTestCall:
            if (!m_skipLevel && okey != or_op) {
                if (curr.size() != 1) {
                    if (!m_cumulative || !curr.isEmpty())
                        evalError(fL1S("Test name must expand to exactly one word."));
                    skipExpression(tokPtr);
                    okey = false;
                } else {
                    traceMsg("evaluating test function %s", dbgStr(curr.at(0)));
                    ret = evaluateConditionalFunction(curr.at(0).toKey(), tokPtr);
                    switch (ret) {
                    case ReturnTrue: okey = true; break;
                    case ReturnFalse: okey = false; break;
                    default:
                        traceMsg("aborting block, function status: %s", dbgReturn(ret));
                        return ret;
                    }
                    traceMsg("test function returned %s", dbgBool(okey));
                    okey ^= invert;
                }
            } else if (m_cumulative) {
#ifdef PROEVALUATOR_CUMULATIVE
                m_skipLevel++;
                if (curr.size() != 1)
                    skipExpression(tokPtr);
                else
                    evaluateConditionalFunction(curr.at(0).toKey(), tokPtr);
                m_skipLevel--;
#endif
            } else {
                skipExpression(tokPtr);
                traceMsg("skipped test function %s", curr.size() == 1 ? dbgStr(curr.at(0)) : "<invalid>");
            }
            or_op = !okey; // tentatively force next evaluation
            invert = false;
            curr.clear();
            continue;
        case TokReturn:
            m_returnValue = curr;
            curr.clear();
            ret = ReturnReturn;
            goto ctrlstm;
        case TokBreak:
            ret = ReturnBreak;
            goto ctrlstm;
        case TokNext:
            ret = ReturnNext;
          ctrlstm:
            if (!m_skipLevel && okey != or_op) {
                traceMsg("flow control statement '%s', aborting block", dbgReturn(ret));
                return ret;
            }
            traceMsg("skipped flow control statement '%s'", dbgReturn(ret));
            okey = false, or_op = true; // force next evaluation
            continue;
        default: {
                const ushort *oTokPtr = --tokPtr;
                ret = evaluateExpression(tokPtr, &curr, false);
                if (ret == ReturnError || tokPtr != oTokPtr)
                    break;
            }
            Q_ASSERT_X(false, "visitProBlock", "unexpected item type");
            continue;
        }
        if (ret != ReturnTrue && ret != ReturnFalse) {
            traceMsg("aborting block, status: %s", dbgReturn(ret));
            return ret;
        }
    }
    traceMsg("leaving block, okey=%s", dbgBool(okey));
    return returnBool(okey);
}